

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  long lVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar11 = (undefined1 (*) [32])(sVar5 * uVar10 * sVar4 + (long)pvVar3);
    fVar1 = (this->super_Clip).min;
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    auVar16._16_4_ = fVar1;
    auVar16._20_4_ = fVar1;
    auVar16._24_4_ = fVar1;
    auVar16._28_4_ = fVar1;
    fVar1 = (this->super_Clip).max;
    auVar18._4_4_ = fVar1;
    auVar18._0_4_ = fVar1;
    auVar18._8_4_ = fVar1;
    auVar18._12_4_ = fVar1;
    auVar18._16_4_ = fVar1;
    auVar18._20_4_ = fVar1;
    auVar18._24_4_ = fVar1;
    auVar18._28_4_ = fVar1;
    lVar12 = 0;
    for (iVar14 = 0; iVar14 + 7 < iVar8; iVar14 = iVar14 + 8) {
      auVar7 = vmaxps_avx(auVar16,*pauVar11);
      auVar7 = vminps_avx(auVar7,auVar18);
      *pauVar11 = auVar7;
      pauVar11 = pauVar11 + 1;
      lVar12 = lVar12 + 8;
    }
    fVar1 = (this->super_Clip).min;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    fVar1 = (this->super_Clip).max;
    auVar17._4_4_ = fVar1;
    auVar17._0_4_ = fVar1;
    auVar17._8_4_ = fVar1;
    auVar17._12_4_ = fVar1;
    for (; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
      auVar6 = vmaxps_avx(auVar15,*(undefined1 (*) [16])*pauVar11);
      auVar6 = vminps_avx(auVar6,auVar17);
      *(undefined1 (*) [16])*pauVar11 = auVar6;
      pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
      lVar12 = lVar12 + 4;
    }
    lVar13 = sVar5 * sVar4 * uVar10;
    for (; (int)lVar12 < iVar8; lVar12 = lVar12 + 1) {
      fVar2 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar13);
      fVar1 = (this->super_Clip).min;
      if (fVar2 < fVar1) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar13) = fVar1;
        fVar2 = fVar1;
      }
      fVar1 = (this->super_Clip).max;
      if (fVar1 < fVar2) {
        *(float *)((long)pvVar3 + lVar12 * 4 + lVar13) = fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}